

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  String local_68;
  Token *local_48;
  uint *local_40;
  Reader *local_38;
  
  local_48 = token;
  if ((long)end - (long)*current < 4) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Bad unicode escape sequence in string: four digits expected.",""
              );
    addError(this,&local_68,local_48,*current);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar7 = false;
  }
  else {
    bVar7 = false;
    uVar6 = 0;
    uVar5 = 0;
    local_40 = ret_unicode;
    local_38 = this;
    do {
      pcVar2 = *current;
      *current = pcVar2 + 1;
      cVar1 = *pcVar2;
      iVar4 = (int)cVar1;
      uVar5 = uVar5 * 0x10;
      if ((byte)(cVar1 - 0x30U) < 10) {
        uVar5 = (uVar5 + iVar4) - 0x30;
LAB_001299d9:
        bVar3 = true;
      }
      else {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar5 = (uVar5 + iVar4) - 0x57;
          goto LAB_001299d9;
        }
        if ((byte)(cVar1 + 0xbfU) < 6) {
          uVar5 = (uVar5 + iVar4) - 0x37;
          goto LAB_001299d9;
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "Bad unicode escape sequence in string: hexadecimal digit expected.","");
        addError(this,&local_68,local_48,*current);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
        this = local_38;
      }
      if (!bVar3) break;
      bVar7 = 2 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
    if (bVar7) {
      *local_40 = uVar5;
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token, Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.", token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token, current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}